

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

char * Acb_EnumerateSatAssigns
                 (sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,Vec_Int_t *vTempLits
                 ,Vec_Str_t *vTempSop)

{
  char *pcVar1;
  char Entry;
  Vec_Str_t *p;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int pLits [2];
  int local_54;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  ulong local_40;
  Vec_Str_t *local_38;
  
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x5e6,
                  "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  pLits[0] = Abc_Var2Lit(PivotVar,1);
  pLits[1] = Abc_Var2Lit(FreeVar,0);
  vTempSop->nSize = 0;
  Vec_StrGrow(vTempSop,vDivVars->nSize * 8 + 0x19);
  iVar2 = sat_solver_solve(pSat,pLits,&local_54,0,0,0,0);
  if (iVar2 != -1) {
    pLits[0] = Abc_LitNot(pLits[0]);
    iVar2 = sat_solver_solve(pSat,pLits,&local_54,0,0,0,0);
    pLits[0] = Abc_LitNot(pLits[0]);
    if ((iVar2 == -1) || (vDivVars->nSize == 0)) {
      Vec_StrPush(vTempSop,' ');
      Entry = '1';
      goto LAB_0032922c;
    }
    local_50 = Vec_IntAlloc(100);
    local_48 = Vec_IntAlloc(100);
    uVar6 = 0;
    local_38 = vTempSop;
    while ((int)uVar6 != 1000) {
      local_40 = uVar6;
      iVar2 = sat_solver_solve(pSat,pLits,&local_54,0,0,0,0);
      if (iVar2 != 1) {
        if (iVar2 != -1) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x623,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        printf("Finished enumerating %d cubes.\n");
        Vec_IntFree(local_50);
        Vec_IntFree(local_48);
        goto LAB_00329240;
      }
      vTempLits->nSize = 0;
      iVar2 = Abc_LitNot(pLits[0]);
      Vec_IntPush(vTempLits,iVar2);
      iVar2 = vDivVars->nSize;
      while (0 < iVar2) {
        iVar2 = iVar2 + -1;
        uVar3 = Vec_IntEntry(vDivVars,iVar2);
        if (((int)uVar3 < 0) || (pSat->size <= (int)uVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(vTempLits,(uint)(pSat->model[uVar3] != 1) + uVar3 * 2);
      }
      for (iVar2 = 0; iVar2 < vDivVars->nSize; iVar2 = iVar2 + 1) {
        Vec_StrPush(vTempSop,'-');
      }
      iVar2 = Vec_IntEntry(vTempLits,0);
      iVar2 = sat_solver_push(pSat,iVar2);
      if (iVar2 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x636,
                      "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                     );
      }
      iVar2 = sat_solver_minimize_assumptions(pSat,vTempLits->pArray + 1,vTempLits->nSize + -1,0);
      Vec_IntShrink(vTempLits,iVar2 + 1);
      sat_solver_pop(pSat);
      iVar2 = Abc_LitNot(pLits[1]);
      Vec_IntWriteEntry(vTempLits,0,iVar2);
      for (iVar2 = 1; vTempSop = local_38, iVar2 < vTempLits->nSize; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vTempLits,iVar2);
        iVar5 = Abc_LitNot(iVar4);
        Vec_IntWriteEntry(vTempLits,iVar2,iVar5);
        iVar5 = Abc_Lit2Var(iVar4);
        p = local_38;
        uVar3 = vDivVars->nSize;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        uVar7 = 0;
        while( true ) {
          if (uVar6 == uVar7) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x63f,
                          "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                         );
          }
          if (vDivVars->pArray[uVar7] == iVar5) break;
          uVar7 = uVar7 + 1;
          uVar3 = uVar3 - 1;
        }
        iVar5 = local_38->nSize;
        local_54 = iVar2;
        iVar4 = Abc_LitIsCompl(iVar4);
        iVar2 = local_54;
        Vec_StrWriteEntry(p,iVar5 - uVar3,(byte)iVar4 ^ 0x31);
      }
      Vec_StrAppend(local_38," 1\n");
      iVar2 = sat_solver_addclause(pSat,vTempLits->pArray,vTempLits->pArray + vTempLits->nSize);
      if (iVar2 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x68f,
                      "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                     );
      }
      uVar6 = (ulong)((int)local_40 + 1);
    }
    if (vDivVars->nSize != 0) {
      puts("Reached the limit on the number of cubes (1000).");
      Vec_IntFree(local_50);
      Vec_IntFree(local_48);
      return (char *)0x0;
    }
    puts("Assuming constant 0 function.");
    vTempSop->nSize = 0;
  }
  Vec_StrPush(vTempSop,' ');
  Entry = '0';
LAB_0032922c:
  Vec_StrPush(vTempSop,Entry);
  Vec_StrPush(vTempSop,'\n');
LAB_00329240:
  Vec_StrPush(vTempSop,'\0');
  pcVar1 = vTempSop->pArray;
  vTempSop->nCap = 0;
  vTempSop->nSize = 0;
  vTempSop->pArray = (char *)0x0;
  return pcVar1;
}

Assistant:

char * Acb_EnumerateSatAssigns( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, Vec_Int_t * vTempLits, Vec_Str_t * vTempSop )
{
    int fCreatePrime = 1;
    int status, i, iMint, iVar, iLit, nFinal, * pFinal, pLits[2];
    Vec_Int_t * vTemp, * vLits;
    assert( FreeVar < sat_solver_nvars(pSat) );
    pLits[0] = Abc_Var2Lit( PivotVar, 1 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    Vec_StrClear( vTempSop );
    Vec_StrGrow( vTempSop, 8 * (Vec_IntSize(vDivVars) + 3) + 1 );
    // check constant 0
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    if ( status == l_False )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '0' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    // check constant 1
    pLits[0] = Abc_LitNot(pLits[0]);
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    pLits[0] = Abc_LitNot(pLits[0]);
    if ( status == l_False || Vec_IntSize(vDivVars) == 0 )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '1' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    //Vec_IntPrint( vDivVars );
    vTemp = Vec_IntAlloc( 100 );
    vLits = Vec_IntAlloc( 100 );
    for ( iMint = 0; ; iMint++ )
    {
        if ( iMint == 1000 )
        {
            if ( Vec_IntSize(vDivVars) == 0 )
            {
                printf( "Assuming constant 0 function.\n" );
                Vec_StrClear( vTempSop );
                Vec_StrPush( vTempSop, ' ' );
                Vec_StrPush( vTempSop, '0' );
                Vec_StrPush( vTempSop, '\n' );
                Vec_StrPush( vTempSop, '\0' );
                return Vec_StrReleaseArray(vTempSop);
            }

            printf( "Reached the limit on the number of cubes (1000).\n" );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            return NULL;
        }
        //int Offset = Vec_StrSize(vTempSop);
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            printf( "Finished enumerating %d cubes.\n", iMint );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            Vec_StrPush( vTempSop, '\0' );
            return Vec_StrReleaseArray(vTempSop);
        }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vTempLits );
        Vec_IntPush( vTempLits, Abc_LitNot(pLits[0]) ); // F = 0
        //printf( "%8d %3d  ", 0, 0 );
//        Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntForEachEntryReverse( vDivVars, iVar, i )
        {
            Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            //printf( "%c", '0' + sat_solver_var_value(pSat, iVar) );
        }
        //printf( "\n" );
        // create new cube
        for ( i = 0; i < Vec_IntSize(vDivVars); i++ )
            Vec_StrPush( vTempSop, '-' );
        if ( fCreatePrime )
        {
            // expand against offset
            status = sat_solver_push(pSat, Vec_IntEntry(vTempLits, 0));
            assert( status == 1 );
            nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTempLits)+1, Vec_IntSize(vTempLits)-1, 0 );
            Vec_IntShrink( vTempLits, nFinal+1 );
            sat_solver_pop(pSat);
            // compute cube and add clause
            Vec_IntWriteEntry( vTempLits, 0, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
            {
                Vec_IntWriteEntry( vTempLits, i, Abc_LitNot(iLit) );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
        }
        else
        {
            // expand against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Selected onset minterm number %d belongs to the offset (this is a bug).\n", iMint );
            assert( status == l_False );

            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntSelectSort( pFinal, nFinal );
/*
            // pretend that this is final
            veci_resize(&pSat->conf_final,0);
            Vec_IntForEachEntry( vTempLits, iLit, i )
                veci_push(&pSat->conf_final, lit_neg(iLit));
            pFinal = pSat->conf_final.ptr;
            nFinal = Vec_IntSize(vTempLits);
*/
            ////////////////////////////////////////////////////////
            // create new cube
            Vec_IntClear( vTemp );
            Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTemp, Abc_LitNot(pFinal[i]) );
            }

            //Vec_IntPrint( vTemp );
            // try removing each one starting with the last one
            //printf( "Started with %d lits   ", nFinal-1 );
            for ( i = nFinal - 1; i > 0; i-- )
            {
                int iLit = Vec_IntEntry( vTemp, i );
                Vec_IntDrop( vTemp, i );
                // try SAT
                status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), 0, 0, 0, 0 );
                if ( status == l_False )
                {
                //    printf( "U" );
                    continue;
                }
                //if ( status == l_True )
                //    printf( "S" );
                //else if ( status == l_Undef )
                //    printf( "T" );
                Vec_IntInsert( vTemp, i, iLit );
            }
            //printf( "   Ended up with %d lits\n", Vec_IntSize(vTemp)-1 );
            //Vec_IntPrint( vTemp );

            Vec_IntForEachEntry( vTemp, iLit, i )
                pFinal[i] = Abc_LitNot(iLit);
            nFinal = Vec_IntSize(vTemp);
            ////////////////////////////////////////////////////////


            Vec_IntClear( vTempLits );
            Vec_IntPush( vTempLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTempLits, pFinal[i] );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
            }
        }
        //printf( "%6d : %8d %3d  ", iMint, (int)pSat->stats.conflicts, Vec_IntSize(vTempLits)-1 );

        Vec_StrAppend( vTempSop, " 1\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        assert( status );

        //Vec_StrPush( vTempSop, '\0' );
        //printf( "%s", Vec_StrEntryP(vTempSop, Offset) );
        //Vec_StrPop( vTempSop );
    }
    assert( 0 ); 
    return NULL;
}